

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Spc_Emu::play_(Spc_Emu *this,long count,sample_t_conflict1 *out)

{
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  Spc_Emu *this_00;
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  Spc_Emu *in_RSI;
  Music_Emu *in_RDI;
  blargg_err_t blargg_return_err_;
  long n;
  long remain;
  sample_t_conflict1 *in_stack_ffffffffffffffc8;
  long in_stack_ffffffffffffffd0;
  Spc_Emu *in_stack_ffffffffffffffd8;
  blargg_err_t local_8;
  
  lVar2 = Music_Emu::sample_rate(in_RDI);
  this_00 = in_RSI;
  if (lVar2 == 32000) {
    local_8 = play_and_filter(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffc8);
  }
  else {
    while (0 < (long)this_00) {
      sVar3 = Fir_Resampler<24>::read
                        ((Fir_Resampler<24> *)&in_RDI[1].super_Gme_File.track_count_,
                         in_EDX + ((int)in_RSI - (int)this_00) * 2,
                         (void *)((ulong)this_00 & 0xffffffff),in_RCX);
      in_RCX = (size_t)(int)sVar3;
      this_00 = (Spc_Emu *)((long)this_00 - in_RCX);
      if (0 < (long)this_00) {
        iVar1 = Fir_Resampler_::max_write((Fir_Resampler_ *)in_RDI);
        lVar2 = (long)iVar1;
        Fir_Resampler_::buffer((Fir_Resampler_ *)&in_RDI[1].super_Gme_File.track_count_);
        in_stack_ffffffffffffffc8 =
             (sample_t_conflict1 *)play_and_filter(this_00,lVar2,in_stack_ffffffffffffffc8);
        if (in_stack_ffffffffffffffc8 != (sample_t_conflict1 *)0x0) {
          return (blargg_err_t)in_stack_ffffffffffffffc8;
        }
        Fir_Resampler_::write
                  ((Fir_Resampler_ *)&in_RDI[1].super_Gme_File.track_count_,(int)lVar2,__buf,in_RCX)
        ;
      }
    }
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t Spc_Emu::play_( long count, sample_t* out )
{
	if ( sample_rate() == native_sample_rate )
		return play_and_filter( count, out );
	
	long remain = count;
	while ( remain > 0 )
	{
		remain -= resampler.read( &out [count - remain], remain );
		if ( remain > 0 )
		{
			long n = resampler.max_write();
			RETURN_ERR( play_and_filter( n, resampler.buffer() ) );
			resampler.write( n );
		}
	}
	check( remain == 0 );
	return 0;
}